

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O0

int secp256k1_whitelist_compute_keys_and_message
              (secp256k1_context *ctx,uchar *msg32,secp256k1_gej *keys,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,int n_keys,
              secp256k1_pubkey *sub_pubkey)

{
  int iVar1;
  undefined1 local_268 [8];
  secp256k1_gej tweaked_gej;
  secp256k1_ge online_ge;
  secp256k1_ge offline_ge;
  secp256k1_ge subkey_ge;
  undefined1 local_d8 [4];
  int i;
  secp256k1_sha256 sha;
  size_t size;
  uchar c [33];
  int n_keys_local;
  secp256k1_pubkey *offline_pubkeys_local;
  secp256k1_pubkey *online_pubkeys_local;
  secp256k1_gej *keys_local;
  uchar *msg32_local;
  secp256k1_context *ctx_local;
  
  sha.bytes = 0x21;
  secp256k1_sha256_initialize((secp256k1_sha256 *)local_d8);
  secp256k1_pubkey_load(ctx,(secp256k1_ge *)&offline_ge.infinity,sub_pubkey);
  iVar1 = secp256k1_eckey_pubkey_serialize
                    ((secp256k1_ge *)&offline_ge.infinity,(uchar *)&size,&sha.bytes,0x102);
  if (iVar1 == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_sha256_write((secp256k1_sha256 *)local_d8,(uchar *)&size,sha.bytes);
    for (subkey_ge._84_4_ = 0; (int)subkey_ge._84_4_ < n_keys;
        subkey_ge._84_4_ = subkey_ge._84_4_ + 1) {
      secp256k1_pubkey_load
                (ctx,(secp256k1_ge *)&online_ge.infinity,offline_pubkeys + (int)subkey_ge._84_4_);
      iVar1 = secp256k1_eckey_pubkey_serialize
                        ((secp256k1_ge *)&online_ge.infinity,(uchar *)&size,&sha.bytes,0x102);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_sha256_write((secp256k1_sha256 *)local_d8,(uchar *)&size,sha.bytes);
      secp256k1_pubkey_load
                (ctx,(secp256k1_ge *)&tweaked_gej.infinity,online_pubkeys + (int)subkey_ge._84_4_);
      iVar1 = secp256k1_eckey_pubkey_serialize
                        ((secp256k1_ge *)&tweaked_gej.infinity,(uchar *)&size,&sha.bytes,0x102);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_sha256_write((secp256k1_sha256 *)local_d8,(uchar *)&size,sha.bytes);
      secp256k1_gej_set_ge((secp256k1_gej *)local_268,(secp256k1_ge *)&online_ge.infinity);
      secp256k1_gej_add_ge_var
                ((secp256k1_gej *)local_268,(secp256k1_gej *)local_268,
                 (secp256k1_ge *)&offline_ge.infinity,(secp256k1_fe *)0x0);
      secp256k1_whitelist_tweak_pubkey((secp256k1_gej *)local_268);
      secp256k1_gej_add_ge_var
                (keys + (int)subkey_ge._84_4_,(secp256k1_gej *)local_268,
                 (secp256k1_ge *)&tweaked_gej.infinity,(secp256k1_fe *)0x0);
    }
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_d8,msg32);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int secp256k1_whitelist_compute_keys_and_message(const secp256k1_context* ctx, unsigned char *msg32, secp256k1_gej *keys, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const int n_keys, const secp256k1_pubkey *sub_pubkey) {
    unsigned char c[33];
    size_t size = 33;
    secp256k1_sha256 sha;
    int i;
    secp256k1_ge subkey_ge;

    secp256k1_sha256_initialize(&sha);
    secp256k1_pubkey_load(ctx, &subkey_ge, sub_pubkey);

    /* commit to sub-key */
    if (!secp256k1_eckey_pubkey_serialize(&subkey_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    secp256k1_sha256_write(&sha, c, size);
    for (i = 0; i < n_keys; i++) {
        secp256k1_ge offline_ge;
        secp256k1_ge online_ge;
        secp256k1_gej tweaked_gej;

        /* commit to fixed keys */
        secp256k1_pubkey_load(ctx, &offline_ge, &offline_pubkeys[i]);
        if (!secp256k1_eckey_pubkey_serialize(&offline_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        secp256k1_sha256_write(&sha, c, size);
        secp256k1_pubkey_load(ctx, &online_ge, &online_pubkeys[i]);
        if (!secp256k1_eckey_pubkey_serialize(&online_ge, c, &size, SECP256K1_EC_COMPRESSED)) {
            return 0;
        }
        secp256k1_sha256_write(&sha, c, size);

        /* compute tweaked keys */
        secp256k1_gej_set_ge(&tweaked_gej, &offline_ge);
        secp256k1_gej_add_ge_var(&tweaked_gej, &tweaked_gej, &subkey_ge, NULL);
        secp256k1_whitelist_tweak_pubkey(&tweaked_gej);
        secp256k1_gej_add_ge_var(&keys[i], &tweaked_gej, &online_ge, NULL);
    }
    secp256k1_sha256_finalize(&sha, msg32);
    return 1;
}